

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void extract_reference_file(char *name)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  FILE *__stream;
  char *pcVar5;
  FILE *__stream_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  char buff [1024];
  undefined4 local_438;
  short local_434;
  
  sprintf((char *)&local_438,"%s/%s.uu",refdir,name);
  __stream = fopen((char *)&local_438,"r");
  failure("Couldn\'t open reference file %s",&local_438);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/main.c"
                   ,L'ࢊ',(uint)(__stream != (FILE *)0x0),"in != NULL",(void *)0x0);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar5 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) {
        return;
      }
    } while (local_434 != 0x206e || local_438 != 0x69676562);
    __stream_00 = fopen(name,"wb");
    do {
      pcVar5 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) break;
      bVar3 = local_438._2_1_ == 'd';
      bVar4 = (short)local_438 == 0x6e65;
      if (bVar3 && bVar4) break;
      if ((local_438 & 0x3f) != 0x20) {
        uVar7 = local_438 & 0x3f ^ 0x20;
        pbVar9 = (byte *)((long)&local_438 + 1);
        do {
          uVar6 = (pbVar9[1] & 0x3f ^ 0x20) << 0xc | (*pbVar9 & 0x3f ^ 0x20) << 0x12;
          fputc(uVar6 >> 0x10,__stream_00);
          if (uVar7 == 1) {
            pbVar9 = pbVar9 + 2;
            iVar8 = 0;
          }
          else {
            pbVar1 = pbVar9 + 2;
            pbVar9 = pbVar9 + 3;
            uVar6 = uVar6 | (*pbVar1 & 0x3f ^ 0x20) << 6;
            fputc(uVar6 >> 8 & 0xff,__stream_00);
            iVar8 = uVar7 - 2;
          }
          uVar7 = 0;
          if (0 < iVar8) {
            bVar2 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            fputc(uVar6 & 0xff | bVar2 & 0x3f ^ 0x20,__stream_00);
            uVar7 = iVar8 - 1;
          }
        } while (0 < (int)uVar7);
      }
    } while (!bVar3 || !bVar4);
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	sprintf(buff, "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	/* Not a lot of error checking here; the input better be right. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			if (bytes > 0) {
				n = UUDECODE(*p++) << 18;
				n |= UUDECODE(*p++) << 12;
				fputc(n >> 16, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}